

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O0

bool __thiscall
despot::BaseRockSample::GetObservation
          (BaseRockSample *this,double rand_num,RockSampleState *rockstate,int rock)

{
  bool bVar1;
  undefined8 uVar2;
  const_reference pvVar3;
  double dVar4;
  __type _Var5;
  double efficiency;
  double distance;
  int rock_local;
  RockSampleState *rockstate_local;
  double rand_num_local;
  BaseRockSample *this_local;
  
  uVar2 = GetRobPos(this,&rockstate->super_State);
  pvVar3 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                     (&this->rock_pos_,(long)rock);
  dVar4 = (double)despot::Coord::EuclideanDistance(uVar2,*(undefined8 *)pvVar3);
  _Var5 = std::pow<int,double>(2,-dVar4 / this->half_efficiency_distance_);
  if ((_Var5 + 1.0) * 0.5 <= rand_num) {
    bVar1 = GetRock(this,&rockstate->super_State,rock);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  else {
    this_local._7_1_ = GetRock(this,&rockstate->super_State,rock);
  }
  return this_local._7_1_;
}

Assistant:

bool BaseRockSample::GetObservation(double rand_num,
	const RockSampleState& rockstate, int rock) const {
	double distance = Coord::EuclideanDistance(GetRobPos(&rockstate),
		rock_pos_[rock]);
	double efficiency = (1 + pow(2, -distance / half_efficiency_distance_))
		* 0.5;

	if (rand_num < efficiency)
		return GetRock(&rockstate, rock) & E_GOOD;
	else
		return !(GetRock(&rockstate, rock) & E_GOOD);
}